

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

lyxp_expr * lyxp_parse_expr(char *expr)

{
  ushort uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  int iVar4;
  lyxp_token lVar5;
  uint uVar6;
  uint uVar7;
  lyxp_expr *expr_00;
  char *pcVar8;
  lyxp_token *ptr;
  uint8_t *ptr_00;
  ulong uVar9;
  ulong uVar10;
  ushort **ppuVar11;
  uint8_t **ppuVar12;
  LY_ERR *pLVar13;
  char cVar14;
  ulong uVar15;
  long lVar16;
  short sVar17;
  ulong uVar18;
  lyxp_token lVar19;
  ushort uVar20;
  bool bVar21;
  uint16_t *local_80;
  
  expr_00 = (lyxp_expr *)calloc(1,0x30);
  if (expr_00 != (lyxp_expr *)0x0) {
    pcVar8 = strdup(expr);
    expr_00->expr = pcVar8;
    if (pcVar8 != (char *)0x0) {
      expr_00->size = 10;
      ptr = (lyxp_token *)malloc(0x28);
      expr_00->tokens = ptr;
      if (ptr != (lyxp_token *)0x0) {
        local_80 = (uint16_t *)malloc(0x14);
        expr_00->expr_pos = local_80;
        if (local_80 != (uint16_t *)0x0) {
          ptr_00 = (uint8_t *)malloc(10);
          expr_00->tok_len = ptr_00;
          if (ptr_00 != (uint8_t *)0x0) {
            uVar20 = 0;
            while ((uVar10 = (ulong)(byte)expr[uVar20], uVar10 < 0x21 &&
                   ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0))) {
              uVar20 = uVar20 + 1;
            }
            uVar18 = 0;
            lVar19 = LYXP_TOKEN_NONE;
            uVar15 = 10;
            do {
              uVar9 = (ulong)uVar20;
              pcVar8 = expr + uVar9;
              cVar14 = (char)uVar10;
              uVar2 = 1;
              iVar4 = (int)uVar10;
              sVar17 = (short)uVar18;
              uVar18 = uVar18 & 0xffff;
              switch(iVar4) {
              case 0x22:
                uVar2 = 1;
                do {
                  uVar10 = (ulong)uVar2;
                  uVar2 = uVar2 + 1;
                } while (pcVar8[uVar10] != '\"');
                goto LAB_0015f9f6;
              case 0x23:
              case 0x24:
              case 0x25:
              case 0x26:
              case 0x2a:
              case 0x2b:
              case 0x2d:
switchD_0015f7e0_caseD_23:
                ppuVar11 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar11 + (long)cVar14 * 2 + 1) & 8) == 0) {
                  if (cVar14 == '!') {
                    if (pcVar8[1] != '=') {
LAB_0015fb15:
                      if ((sVar17 == 0) ||
                         ((ptr[(int)uVar18 - 1] < LYXP_TOKEN_LITERAL &&
                          ((0x1f18aU >>
                            (ptr[(int)uVar18 - 1] &
                            (LYXP_TOKEN_OPERATOR_PATH|LYXP_TOKEN_OPERATOR_UNI)) & 1) != 0)))) {
                        if (cVar14 == '*') {
                          lVar5 = LYXP_TOKEN_NAMETEST;
                          break;
                        }
                        uVar2 = parse_ncname(pcVar8);
                        if (uVar2 != 0) {
                          if (expr[uVar2 + uVar9] == ':') {
                            lVar16 = uVar9 + (ushort)(uVar2 + 1);
                            if (expr[lVar16] != '*') {
                              uVar3 = parse_ncname(expr + lVar16);
                              if (uVar3 != 0) {
                                uVar2 = uVar3 + uVar2 + 1;
                                lVar19 = LYXP_TOKEN_NONE;
                                lVar5 = LYXP_TOKEN_NAMETEST;
                                break;
                              }
                              goto LAB_0015fecb;
                            }
                            uVar2 = uVar2 + 2;
                            lVar19 = LYXP_TOKEN_NONE;
                          }
                          else {
                            lVar19 = LYXP_TOKEN_PAR1;
                          }
                          lVar5 = LYXP_TOKEN_NAMETEST;
                          break;
                        }
LAB_0015fecb:
                        cVar14 = *pcVar8;
                      }
                      else {
                        if (cVar14 == '*') goto LAB_0015fc5c;
                        if (iVar4 == 0x61) {
                          if (pcVar8[1] == 'n') {
                            uVar2 = 3;
                            bVar21 = pcVar8[2] == 'd';
LAB_0015fe06:
                            lVar5 = LYXP_TOKEN_OPERATOR_LOG;
LAB_0015fe5c:
                            if (bVar21) break;
                          }
                        }
                        else if (iVar4 == 100) {
                          if (pcVar8[1] == 'i') {
                            bVar21 = pcVar8[2] == 'v';
LAB_0015fe5a:
                            uVar2 = 3;
                            lVar5 = LYXP_TOKEN_OPERATOR_MATH;
                            goto LAB_0015fe5c;
                          }
                        }
                        else if (iVar4 == 0x6d) {
                          if (pcVar8[1] == 'o') {
                            bVar21 = pcVar8[2] == 'd';
                            goto LAB_0015fe5a;
                          }
                        }
                        else if (iVar4 == 0x6f) {
                          uVar2 = 2;
                          bVar21 = pcVar8[1] == 'r';
                          goto LAB_0015fe06;
                        }
                      }
                      ly_vlog(LYE_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)cVar14,pcVar8);
                      goto LAB_0015feaf;
                    }
LAB_0015fb09:
                    uVar3 = 2;
LAB_0015fb0e:
                    uVar2 = uVar3;
                    lVar5 = LYXP_TOKEN_OPERATOR_COMP;
                  }
                  else if ((iVar4 == 0x2b) || (iVar4 == 0x2d)) {
LAB_0015fc5c:
                    lVar5 = LYXP_TOKEN_OPERATOR_MATH;
                  }
                  else {
                    if (iVar4 != 0x7c) {
                      uVar3 = 1;
                      if (iVar4 == 0x3c) {
LAB_0015fad8:
                        if (pcVar8[1] == '=') goto LAB_0015fb09;
                      }
                      else if (iVar4 != 0x3d) {
                        if (iVar4 != 0x3e) {
                          if (iVar4 != 0x2f) goto LAB_0015fb15;
                          uVar2 = (pcVar8[1] == '/') + 1;
                          lVar5 = LYXP_TOKEN_OPERATOR_PATH;
                          break;
                        }
                        goto LAB_0015fad8;
                      }
                      goto LAB_0015fb0e;
                    }
                    lVar5 = LYXP_TOKEN_OPERATOR_UNI;
                  }
                }
                else {
LAB_0015fa6c:
                  uVar2 = 0xffff;
                  do {
                    uVar2 = uVar2 + 1;
                  } while ((*(byte *)((long)*ppuVar11 + (long)expr[uVar2 + uVar9] * 2 + 1) & 8) != 0
                          );
                  if (expr[uVar2 + uVar9] == '.') {
                    do {
                      uVar2 = uVar2 + 1;
                    } while ((*(byte *)((long)*ppuVar11 + (long)expr[uVar2 + uVar9] * 2 + 1) & 8) !=
                             0);
                  }
                  lVar5 = LYXP_TOKEN_NUMBER;
                }
                break;
              case 0x27:
                uVar2 = 1;
                do {
                  uVar10 = (ulong)uVar2;
                  uVar2 = uVar2 + 1;
                } while (pcVar8[uVar10] != '\'');
LAB_0015f9f6:
                lVar5 = LYXP_TOKEN_LITERAL;
                break;
              case 0x28:
                uVar2 = 1;
                if (lVar19 != LYXP_TOKEN_NONE) {
                  if ((sVar17 == 0) || (uVar6 = (int)uVar18 - 1, ptr[uVar6] != LYXP_TOKEN_NAMETEST))
                  {
                    lVar5 = LYXP_TOKEN_PAR1;
                    lVar19 = lVar5;
                    break;
                  }
                  if (ptr_00[uVar6] == '\x04') {
                    uVar1 = local_80[uVar6];
                    iVar4 = strncmp(expr + uVar1,"node",4);
                    if ((iVar4 != 0) && (iVar4 = strncmp(expr + uVar1,"text",4), iVar4 != 0))
                    goto LAB_0015f97e;
                  }
                  else {
LAB_0015f97e:
                    if ((ptr_00[uVar18 - 1] != '\a') ||
                       (iVar4 = strncmp(expr + local_80[uVar18 - 1],"comment",7), iVar4 != 0)) {
                      ptr[uVar18 - 1] = LYXP_TOKEN_FUNCNAME;
                      goto LAB_0015fbcb;
                    }
                  }
                  ptr[uVar18 - 1] = LYXP_TOKEN_NODETYPE;
                }
LAB_0015fbcb:
                lVar5 = LYXP_TOKEN_PAR1;
                lVar19 = LYXP_TOKEN_NONE;
                break;
              case 0x29:
                lVar5 = LYXP_TOKEN_PAR2;
                break;
              case 0x2c:
                lVar5 = LYXP_TOKEN_COMMA;
                break;
              case 0x2e:
                if (pcVar8[1] == '.') {
                  uVar2 = 2;
                  lVar5 = LYXP_TOKEN_DDOT;
                }
                else {
                  ppuVar11 = __ctype_b_loc();
                  if ((*(byte *)((long)*ppuVar11 + (long)pcVar8[1] * 2 + 1) & 8) != 0)
                  goto LAB_0015fa6c;
                  lVar5 = LYXP_TOKEN_DOT;
                }
                break;
              default:
                if (iVar4 == 0x40) {
                  lVar5 = LYXP_TOKEN_AT;
                }
                else if (iVar4 == 0x5b) {
                  lVar5 = LYXP_TOKEN_BRACK1;
                }
                else {
                  if (iVar4 != 0x5d) goto switchD_0015f7e0_caseD_23;
                  lVar5 = LYXP_TOKEN_BRACK2;
                }
              }
              if (sVar17 == (short)uVar15) {
                uVar6 = (int)uVar15 + 5;
                expr_00->size = (uint16_t)uVar6;
                uVar7 = uVar6 & 0xffff;
                ptr = (lyxp_token *)ly_realloc(ptr,(ulong)(uVar7 * 4));
                expr_00->tokens = ptr;
                if (ptr == (lyxp_token *)0x0) {
                  pLVar13 = ly_errno_location();
                  *pLVar13 = LY_EMEM;
                  ly_log(LY_LLERR,"Memory allocation failed (%s()).","exp_add_token");
                  ptr = (lyxp_token *)0x0;
                }
                else {
                  local_80 = (uint16_t *)ly_realloc(local_80,(ulong)(uVar7 * 2));
                  expr_00->expr_pos = local_80;
                  if (local_80 == (uint16_t *)0x0) {
                    pLVar13 = ly_errno_location();
                    *pLVar13 = LY_EMEM;
                    ly_log(LY_LLERR,"Memory allocation failed (%s()).","exp_add_token");
                    local_80 = (uint16_t *)0x0;
                  }
                  else {
                    ptr_00 = (uint8_t *)ly_realloc(ptr_00,(ulong)uVar7);
                    expr_00->tok_len = ptr_00;
                    if (ptr_00 != (uint8_t *)0x0) {
                      uVar15 = (ulong)uVar6;
                      goto LAB_0015fd02;
                    }
                    pLVar13 = ly_errno_location();
                    *pLVar13 = LY_EMEM;
                    ly_log(LY_LLERR,"Memory allocation failed (%s()).","exp_add_token");
                    ptr_00 = (uint8_t *)0x0;
                  }
                }
                uVar9 = (ulong)uVar6;
                uVar18 = uVar15;
              }
              else {
LAB_0015fd02:
                ptr[uVar18] = lVar5;
                local_80[uVar18] = uVar20;
                ptr_00[expr_00->used] = (uint8_t)uVar2;
                uVar6 = *(int *)&expr_00->used + 1;
                expr_00->used = (uint16_t)uVar6;
                uVar9 = uVar15;
                uVar18 = (ulong)uVar6;
              }
              uVar20 = uVar2 + uVar20;
              while (uVar10 = (ulong)(byte)expr[uVar20], uVar15 = uVar9, uVar10 < 0x21) {
                if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
                  if (uVar10 == 0) {
                    ppuVar12 = (uint8_t **)calloc(uVar9 & 0xffff,8);
                    expr_00->repeat = ppuVar12;
                    if (ppuVar12 != (uint8_t **)0x0) {
                      return expr_00;
                    }
                    goto LAB_0015fe8d;
                  }
                  break;
                }
                uVar20 = uVar20 + 1;
              }
            } while( true );
          }
        }
      }
    }
  }
LAB_0015fe8d:
  pLVar13 = ly_errno_location();
  *pLVar13 = LY_EMEM;
  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_parse_expr");
LAB_0015feaf:
  lyxp_expr_free(expr_00);
  return (lyxp_expr *)0x0;
}

Assistant:

struct lyxp_expr *
lyxp_parse_expr(const char *expr)
{
    struct lyxp_expr *ret;
    uint16_t parsed = 0, tok_len, ncname_len;
    enum lyxp_token tok_type;
    int prev_function_check = 0;

    /* init lyxp_expr structure */
    ret = calloc(1, sizeof *ret);
    if (!ret) {
        LOGMEM;
        goto error;
    }
    ret->expr = strdup(expr);
    if (!ret->expr) {
        LOGMEM;
        goto error;
    }
    ret->used = 0;
    ret->size = LYXP_EXPR_SIZE_START;
    ret->tokens = malloc(ret->size * sizeof *ret->tokens);
    if (!ret->tokens) {
        LOGMEM;
        goto error;
    }
    ret->expr_pos = malloc(ret->size * sizeof *ret->expr_pos);
    if (!ret->expr_pos) {
        LOGMEM;
        goto error;
    }
    ret->tok_len = malloc(ret->size * sizeof *ret->tok_len);
    if (!ret->tok_len) {
        LOGMEM;
        goto error;
    }

    while (is_xmlws(expr[parsed])) {
        ++parsed;
    }

    do {
        if (expr[parsed] == '(') {

            /* '(' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR1;

            if (prev_function_check && ret->used && (ret->tokens[ret->used - 1] == LYXP_TOKEN_NAMETEST)) {
                /* it is a NodeType/FunctionName after all */
                if (((ret->tok_len[ret->used - 1] == 4)
                        && (!strncmp(&expr[ret->expr_pos[ret->used - 1]], "node", 4)
                        || !strncmp(&expr[ret->expr_pos[ret->used - 1]], "text", 4))) ||
                        ((ret->tok_len[ret->used - 1] == 7)
                        && !strncmp(&expr[ret->expr_pos[ret->used - 1]], "comment", 7))) {
                    ret->tokens[ret->used - 1] = LYXP_TOKEN_NODETYPE;
                } else {
                    ret->tokens[ret->used - 1] = LYXP_TOKEN_FUNCNAME;
                }
                prev_function_check = 0;
            }

        } else if (expr[parsed] == ')') {

            /* ')' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR2;

        } else if (expr[parsed] == '[') {

            /* '[' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK1;

        } else if (expr[parsed] == ']') {

            /* ']' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK2;

        } else if (!strncmp(&expr[parsed], "..", 2)) {

            /* '..' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_DDOT;

        } else if ((expr[parsed] == '.') && (!isdigit(expr[parsed+1]))) {

            /* '.' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_DOT;

        } else if (expr[parsed] == '@') {

            /* '@' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_AT;

        } else if (expr[parsed] == ',') {

            /* ',' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_COMMA;

        } else if (expr[parsed] == '\'') {

            /* Literal with ' */
            for (tok_len = 1; expr[parsed + tok_len] != '\''; ++tok_len);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if (expr[parsed] == '\"') {

            /* Literal with " */
            for (tok_len = 1; expr[parsed + tok_len] != '\"'; ++tok_len);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if ((expr[parsed] == '.') || (isdigit(expr[parsed]))) {

            /* Number */
            for (tok_len = 0; isdigit(expr[parsed + tok_len]); ++tok_len);
            if (expr[parsed + tok_len] == '.') {
                ++tok_len;
                for (; isdigit(expr[parsed + tok_len]); ++tok_len);
            }
            tok_type = LYXP_TOKEN_NUMBER;

        } else if (expr[parsed] == '/') {

            /* Operator '/', '//' */
            if (!strncmp(&expr[parsed], "//", 2)) {
                tok_len = 2;
            } else {
                tok_len = 1;
            }
            tok_type = LYXP_TOKEN_OPERATOR_PATH;

        } else if  (!strncmp(&expr[parsed], "!=", 2) || !strncmp(&expr[parsed], "<=", 2)
                || !strncmp(&expr[parsed], ">=", 2)) {

            /* Operator '!=', '<=', '>=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPERATOR_COMP;

        } else if (expr[parsed] == '|') {

            /* Operator '|' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_UNI;

        } else if ((expr[parsed] == '+') || (expr[parsed] == '-')) {

            /* Operator '+', '-' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_MATH;

        } else if ((expr[parsed] == '=') || (expr[parsed] == '<') || (expr[parsed] == '>')) {

            /* Operator '=', '<', '>' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_COMP;

        } else if (ret->used && (ret->tokens[ret->used - 1] != LYXP_TOKEN_AT)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_PAR1)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_BRACK1)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_COMMA)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_LOG)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_COMP)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_MATH)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_UNI)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_PATH)) {

            /* Operator '*', 'or', 'and', 'mod', or 'div' */
            if (expr[parsed] == '*') {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPERATOR_MATH;

            } else if (!strncmp(&expr[parsed], "or", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPERATOR_LOG;

            } else if (!strncmp(&expr[parsed], "and", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPERATOR_LOG;

            } else if (!strncmp(&expr[parsed], "mod", 3) || !strncmp(&expr[parsed], "div", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPERATOR_MATH;

            } else {
                LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                goto error;
            }
        } else if (expr[parsed] == '*') {

            /* NameTest '*' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_NAMETEST;

        } else {

            /* NameTest (NCName ':' '*' | QName) or NodeType/FunctionName */
            ncname_len = parse_ncname(&expr[parsed]);
            if (!ncname_len) {
                LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                goto error;
            }
            tok_len = ncname_len;

            if (expr[parsed + tok_len] == ':') {
                ++tok_len;
                if (expr[parsed + tok_len] == '*') {
                    ++tok_len;
                } else {
                    ncname_len = parse_ncname(&expr[parsed + tok_len]);
                    if (!ncname_len) {
                        LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                        goto error;
                    }
                    tok_len += ncname_len;
                }
                /* remove old flag to prevent ambiguities */
                prev_function_check = 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            } else {
                /* there is no prefix so it can still be NodeType/FunctioName, we can't finally decide now */
                prev_function_check = 1;
                tok_type = LYXP_TOKEN_NAMETEST;
            }
        }

        /* store the token, move on to the next one */
        exp_add_token(ret, tok_type, parsed, tok_len);
        parsed += tok_len;
        while (is_xmlws(expr[parsed])) {
            ++parsed;
        }

    } while (expr[parsed]);

    /* prealloc repeat */
    ret->repeat = calloc(ret->size, sizeof *ret->repeat);
    if (!ret->repeat) {
        LOGMEM;
        goto error;
    }

    return ret;

error:
    lyxp_expr_free(ret);
    return NULL;
}